

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_576baf::TransformSelector::~TransformSelector(TransformSelector *this)

{
  TransformSelector *this_local;
  
  this->_vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_009d79f8;
  std::__cxx11::string::~string((string *)&this->Tag);
  return;
}

Assistant:

virtual ~TransformSelector() = default;